

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_fan_mgmt(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_fan_mgmt_entry *peVar1;
  envy_bios_power_fan_mgmt *peVar2;
  envy_bios_power_fan_mgmt_entry *e;
  int i;
  envy_bios_power_fan_mgmt *fan_mgmt;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar2 = &(bios->power).fan_mgmt;
  if ((peVar2->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).fan_mgmt.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse FAN_MGMT table at 0x%x, version %x\n",
              (ulong)peVar2->offset,(ulong)(bios->power).fan_mgmt.version);
    }
    else {
      fprintf((FILE *)out,"FAN_MGMT table at 0x%x, version %x\n",(ulong)peVar2->offset,
              (ulong)(bios->power).fan_mgmt.version);
      envy_bios_dump_hex(bios,out,peVar2->offset,(uint)(bios->power).fan_mgmt.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (e._4_4_ = 0; (int)e._4_4_ < (int)(uint)(bios->power).fan_mgmt.entriesnum;
          e._4_4_ = e._4_4_ + 1) {
        peVar1 = (bios->power).fan_mgmt.entries;
        fprintf((FILE *)out,"-- entry %i\n",(ulong)e._4_4_);
        fprintf((FILE *)out,anon_var_dwarf_4a683,(double)peVar1[(int)e._4_4_].temp0 * 0.03125,
                (ulong)peVar1[(int)e._4_4_].duty0,(ulong)peVar1[(int)e._4_4_].speed0);
        fprintf((FILE *)out,anon_var_dwarf_4a68e,(double)peVar1[(int)e._4_4_].temp1 * 0.03125,
                (ulong)peVar1[(int)e._4_4_].duty1,(ulong)peVar1[(int)e._4_4_].speed1);
        fprintf((FILE *)out,anon_var_dwarf_4a699,(double)peVar1[(int)e._4_4_].temp2 / 32.0,
                (ulong)peVar1[(int)e._4_4_].duty2,(ulong)peVar1[(int)e._4_4_].speed2);
        envy_bios_dump_hex(bios,out,(bios->power).fan_mgmt.entries[(int)e._4_4_].offset,
                           (uint)(bios->power).fan_mgmt.rlen,mask);
        if ((mask & 0x80000000) != 0) {
          fprintf((FILE *)out,"\n");
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_fan_mgmt(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_fan_mgmt *fan_mgmt = &bios->power.fan_mgmt;
	int i;

	if (!fan_mgmt->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!fan_mgmt->valid) {
		fprintf(out, "Failed to parse FAN_MGMT table at 0x%x, version %x\n", fan_mgmt->offset, fan_mgmt->version);
		return;
	}

	fprintf(out, "FAN_MGMT table at 0x%x, version %x\n", fan_mgmt->offset, fan_mgmt->version);
	envy_bios_dump_hex(bios, out, fan_mgmt->offset, fan_mgmt->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < fan_mgmt->entriesnum; i++) {
		struct envy_bios_power_fan_mgmt_entry *e = &fan_mgmt->entries[i];

		fprintf(out, "-- entry %i\n", i);
		fprintf(out, "\t 0: { %.2f °C: duty %i => %i rpm }\n", (double)e->temp0 / 32, e->duty0, e->speed0);
		fprintf(out, "\t 1: { %.2f °C: duty %i => %i rpm }\n", (double)e->temp1 / 32, e->duty1, e->speed1);
		fprintf(out, "\t 2: { %.2f °C: duty %i => %i rpm }\n", (double)e->temp2 / 32, e->duty2, e->speed2);

		envy_bios_dump_hex(bios, out, fan_mgmt->entries[i].offset, fan_mgmt->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}